

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O0

VaryingStorage * __thiscall
rsg::VaryingStore::getStorage(VaryingStore *this,VariableType *type,char *name)

{
  mapped_type pVVar1;
  VaryingStorage *__s;
  mapped_type *ppVVar2;
  VaryingStorage *this_00;
  allocator<char> local_81;
  key_type local_80;
  allocator<char> local_49;
  key_type local_48;
  mapped_type local_28;
  VaryingStorage *storage;
  char *name_local;
  VariableType *type_local;
  VaryingStore *this_local;
  
  storage = (VaryingStorage *)name;
  name_local = (char *)type;
  type_local = (VariableType *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  ppVVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>_>_>
            ::operator[](&this->m_values,&local_48);
  pVVar1 = *ppVVar2;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_28 = pVVar1;
  if (pVVar1 == (mapped_type)0x0) {
    this_00 = (VaryingStorage *)operator_new(0x18);
    VaryingStorage::VaryingStorage(this_00,(VariableType *)name_local,this->m_numVertices);
    __s = storage;
    local_28 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,(char *)__s,&local_81);
    ppVVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>_>_>
              ::operator[](&this->m_values,&local_80);
    *ppVVar2 = this_00;
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return local_28;
}

Assistant:

VaryingStorage* VaryingStore::getStorage (const VariableType& type, const char* name)
{
	VaryingStorage* storage = m_values[name];

	if (!storage)
	{
		storage = new VaryingStorage(type, m_numVertices);
		m_values[name] = storage;
	}

	return storage;
}